

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O3

Var __thiscall
Js::DataView::GetValue<short>(DataView *this,Var offset,char16 *funcName,BOOL isLittleEndian)

{
  ushort uVar1;
  uint uVar2;
  ScriptContext *scriptContext;
  uint32 uVar3;
  ushort uVar4;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar2 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (uVar2 < 2) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar3 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,uVar2 - 2,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    uVar1 = *(ushort *)((this->buffer).ptr + uVar3);
    uVar4 = uVar1 << 8 | uVar1 >> 8;
    if (isLittleEndian != 0) {
      uVar4 = uVar1;
    }
    return (Var)((ulong)(uint)(int)(short)uVar4 | 0x1000000000000);
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

Var GetValue(Var offset, const char16* funcName, BOOL isLittleEndian = FALSE)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *typedBuffer;
            }
            return JavascriptNumber::ToVar(item, GetScriptContext());
        }